

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O3

void Fra_ClassesPrepare(Fra_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *__ptr;
  void *__s;
  void **ppvVar6;
  long lVar7;
  Aig_Obj_t **ppAVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  Aig_Obj_t *pAVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  Aig_Obj_t *pAVar16;
  int iVar17;
  Aig_Man_t *pAVar18;
  size_t __size;
  long lVar19;
  
  pAVar18 = p->pAig;
  pVVar9 = pAVar18->vObjs;
  uVar14 = pVVar9->nSize - 1;
  while( true ) {
    do {
      uVar13 = uVar14;
      uVar14 = uVar13 + 1;
    } while ((uVar13 & 1) != 0);
    if (uVar14 < 9) break;
    iVar10 = 5;
    while (uVar14 % (iVar10 - 2U) != 0) {
      uVar3 = iVar10 * iVar10;
      iVar10 = iVar10 + 2;
      if (uVar14 < uVar3) goto LAB_005f7cf4;
    }
  }
LAB_005f7cf4:
  __size = (long)(int)uVar14 << 3;
  __ptr = calloc(1,__size);
  __s = malloc(__size);
  memset(__s,0xff,__size);
  p->vClasses1->nSize = 0;
  if (0 < pVVar9->nSize) {
    lVar19 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar9->pArray[lVar19];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar3 = (uint)*(undefined8 *)&pAVar2->field_0x18;
        if (fLatchCorr == 0) {
          uVar3 = uVar3 & 7;
          if (((uVar3 == 2) || (uVar3 - 5 < 2)) &&
             ((nMaxLevs == 0 ||
              ((int)((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff) <=
               nMaxLevs)))) goto LAB_005f7d6f;
        }
        else if ((uVar3 & 7) == 2) {
LAB_005f7d6f:
          iVar10 = (*p->pFuncNodeHash)(pAVar2,uVar14);
          iVar4 = (*p->pFuncNodeIsConst)(pAVar2);
          if (iVar4 == 0) {
            lVar7 = *(long *)((long)__ptr + (long)iVar10 * 8);
            if (lVar7 == 0) {
              *(Aig_Obj_t **)((long)__ptr + (long)iVar10 * 8) = pAVar2;
              lVar7 = (long)pAVar2->Id;
            }
            else {
              lVar7 = (long)*(int *)(lVar7 + 0x24);
              *(undefined8 *)((long)__s + (long)pAVar2->Id * 8) =
                   *(undefined8 *)((long)__s + lVar7 * 8);
            }
            *(Aig_Obj_t **)((long)__s + lVar7 * 8) = pAVar2;
          }
          else {
            pVVar9 = p->vClasses1;
            uVar3 = pVVar9->nSize;
            if (uVar3 == pVVar9->nCap) {
              if ((int)uVar3 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = 0x10;
              }
              else {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar3 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,(ulong)uVar3 << 4);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = uVar3 * 2;
              }
            }
            else {
              ppvVar6 = pVVar9->pArray;
            }
            iVar10 = pVVar9->nSize;
            pVVar9->nSize = iVar10 + 1;
            ppvVar6[iVar10] = pAVar2;
            *(Aig_Obj_t **)
             (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8)
                 = p->pAig->pConst1;
          }
        }
      }
      lVar19 = lVar19 + 1;
      pAVar18 = p->pAig;
      pVVar9 = pAVar18->vObjs;
    } while (lVar19 < pVVar9->nSize);
  }
  iVar10 = 0;
  if (uVar13 < 0x7fffffff) {
    uVar12 = 0;
    iVar10 = 0;
    do {
      lVar19 = *(long *)((long)__ptr + uVar12 * 8);
      if ((lVar19 != 0) &&
         (lVar7 = *(long *)((long)__s + (long)*(int *)(lVar19 + 0x24) * 8), lVar19 != lVar7)) {
        iVar10 = iVar10 + 1;
        do {
          lVar7 = *(long *)((long)__s + (long)*(int *)(lVar7 + 0x24) * 8);
          iVar10 = iVar10 + 1;
        } while (lVar7 != lVar19);
        if ((*(ulong *)(lVar19 + 0x18) & 0x10) != 0) {
          __assert_fail("ppTable[i]->fMarkA == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                        ,0x153,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
        }
        *(ulong *)(lVar19 + 0x18) = *(ulong *)(lVar19 + 0x18) | 0x10;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar14);
    pAVar18 = p->pAig;
  }
  ppAVar8 = (Aig_Obj_t **)malloc(((long)p->vClasses1->nSize + (long)iVar10) * 0x10);
  p->pMemClasses = ppAVar8;
  p->pMemClassesFree = ppAVar8 + (uint)(iVar10 * 2);
  p->vClasses->nSize = 0;
  pVVar9 = pAVar18->vObjs;
  if (0 < pVVar9->nSize) {
    lVar19 = 0;
    iVar10 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar9->pArray[lVar19];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar12 = *(ulong *)&pAVar2->field_0x18;
        if (((uint)uVar12 & 7) - 7 < 0xfffffffe) {
          if (((uint)uVar12 & 0x17) == 0x12) {
LAB_005f7f8a:
            *(ulong *)&pAVar2->field_0x18 = uVar12 & 0xffffffffffffffef;
            iVar4 = iVar10 * 2;
            ppAVar8 = p->pMemClasses;
            pVVar9 = p->vClasses;
            uVar14 = pVVar9->nSize;
            if (uVar14 == pVVar9->nCap) {
              if ((int)uVar14 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = 0x10;
              }
              else {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar14 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,(ulong)uVar14 << 4);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = uVar14 * 2;
              }
            }
            else {
              ppvVar6 = pVVar9->pArray;
            }
            iVar17 = pVVar9->nSize;
            pVVar9->nSize = iVar17 + 1;
            ppvVar6[iVar17] = ppAVar8 + iVar4;
            pAVar11 = *(Aig_Obj_t **)((long)__s + (long)pAVar2->Id * 8);
            if (pAVar11 == pAVar2) {
              __assert_fail("nNodes > 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                            ,0x16d,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
            }
            iVar5 = 1;
            pAVar16 = pAVar11;
            iVar17 = iVar4;
            do {
              iVar17 = iVar17 + 1;
              pAVar16 = *(Aig_Obj_t **)((long)__s + (long)pAVar16->Id * 8);
              iVar5 = iVar5 + 1;
            } while (pAVar16 != pAVar2);
            p->pMemClasses[iVar4] = pAVar2;
            iVar15 = 1;
            while (pAVar11 != pAVar2) {
              p->pMemClasses[iVar17] = pAVar11;
              iVar1 = pAVar11->Id;
              *(Aig_Obj_t **)
               (*(long *)(*(long *)((long)(pAVar11->field_5).pData + 0x30) + 8) + (long)iVar1 * 8) =
                   pAVar2;
              iVar17 = iVar17 + -1;
              iVar15 = iVar15 + 1;
              pAVar11 = *(Aig_Obj_t **)((long)__s + (long)iVar1 * 8);
            }
            p->pMemClasses[iVar5 + iVar4] = (Aig_Obj_t *)0x0;
            iVar10 = iVar15 + iVar10;
            pAVar18 = p->pAig;
          }
        }
        else if ((uVar12 & 0x10) != 0) goto LAB_005f7f8a;
      }
      lVar19 = lVar19 + 1;
      pVVar9 = pAVar18->vObjs;
    } while (lVar19 < pVVar9->nSize);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  Fra_ClassesRefine(p);
  return;
}

Assistant:

void Fra_ClassesPrepare( Fra_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts;
    Aig_Obj_t * pObj, * pTemp;
    int i, k, nTableSize, nEntries, nNodes, iEntry;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig) );
    ppTable = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    memset( ppTable, 0, sizeof(Aig_Obj_t *) * nTableSize );

    // add all the nodes to the hash table
    Vec_PtrClear( p->vClasses1 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( pObj, nTableSize );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( pObj ) )
        {
            Vec_PtrPush( p->vClasses1, pObj );
            Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pAig) );
            continue;
        }
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
            Fra_ObjSetNext( ppNexts, pObj, pObj );
        }
        else
        {
            Fra_ObjSetNext( ppNexts, pObj, Fra_ObjNext(ppNexts,ppTable[iEntry]) );
            Fra_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
        }
    }

    // count the total number of nodes in the non-trivial classes
    // mark the representative nodes of each equivalence class
    nEntries = 0;
    for ( i = 0; i < nTableSize; i++ )
        if ( ppTable[i] && ppTable[i] != Fra_ObjNext(ppNexts, ppTable[i]) )
        {
            for ( pTemp = Fra_ObjNext(ppNexts, ppTable[i]), k = 1; 
                  pTemp != ppTable[i]; 
                  pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
            assert( k > 1 );
            nEntries += k;
            // mark the node
            assert( ppTable[i]->fMarkA == 0 );
            ppTable[i]->fMarkA = 1;
        }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->vClasses1)) );
    p->pMemClassesFree = p->pMemClasses + 2*nEntries;
 
    // copy the entries into storage in the topological order
    Vec_PtrClear( p->vClasses );
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        // skip the nodes that are not representatives of non-trivial classes
        if ( pObj->fMarkA == 0 )
            continue;
        pObj->fMarkA = 0;
        // add the class of nodes
        Vec_PtrPush( p->vClasses, p->pMemClasses + 2*nEntries );
        // count the number of entries in this class
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
        nNodes = k;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        p->pMemClasses[2*nEntries] = pObj;
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ )
        {
            p->pMemClasses[2*nEntries+nNodes-k] = pTemp;
            Fra_ClassObjSetRepr( pTemp, pObj );
        }
        // add as many empty entries
        p->pMemClasses[2*nEntries + nNodes] = NULL;
        // increment the number of entries
        nEntries += k;
    }
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Fra_ClassesRefine( p );
//    Fra_ClassesPrint( p, 0 );
}